

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::SetUtility
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI_e,Index jaI_e,double ut)

{
  pointer ppBVar1;
  RewardModelDiscreteInterface *pRVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)e;
  ppBVar1 = (this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3;
  if (uVar4 < uVar3) {
    pRVar2 = ppBVar1[uVar4]->_m_utilFunction;
    (*(pRVar2->super_QTableInterface)._vptr_QTableInterface[1])(pRVar2,(ulong)jtI_e,(ulong)jaI_e);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

void 
BayesianGameCollaborativeGraphical::
SetUtility(Index e, 
        const std::vector< Index >& indTypes_e, 
        const std::vector< Index >& actions_e,
        double ut)
{ _m_LRFs.at(e)->SetUtility(indTypes_e, actions_e, ut); }